

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableParameter.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::VariableParameter::Encode(VariableParameter *this,KDataStream *stream)

{
  KUINT8 i;
  long lVar1;
  
  KDataStream::Write(stream,this->m_ui8VarParamType);
  lVar1 = 0;
  do {
    KDataStream::Write(stream,this->m_Data[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xf);
  return;
}

Assistant:

void VariableParameter::Encode( KDataStream & stream ) const
{
	stream << m_ui8VarParamType;
		
	for( KUINT8 i = 0; i < 15; ++i )
	{
		stream << m_Data[i];
	}
}